

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O0

bool tinyusdz::prim::ReconstructPrim<tinyusdz::Skeleton>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,Skeleton *skel,
               string *warn,string *err,PrimReconstructOptions *options)

{
  Path *pPVar1;
  bool bVar2;
  __type _Var3;
  Relationship *this;
  Attribute *this_00;
  AttrMeta *pAVar4;
  AttrMeta *pAVar5;
  size_type sVar6;
  mapped_type *this_01;
  ostream *poVar7;
  Property *pPVar8;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar9;
  TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
  *in_stack_ffffffffffffe6e8;
  bool local_18d9;
  bool local_18b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1868 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1848 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1828;
  ostringstream local_1808 [8];
  ostringstream ss_e_7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1680 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1660 [39];
  allocator local_1639;
  string local_1638 [32];
  fmt local_1618 [32];
  ostringstream local_15f8 [8];
  ostringstream ss_e_6;
  allocator local_1479;
  string local_1478;
  string local_1458;
  undefined1 local_1438 [8];
  ParseResult ret_4;
  allocator local_13f9;
  value_type local_13f8 [4];
  function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_13d8;
  allocator local_13b1;
  string local_13b0;
  undefined1 local_1390 [8];
  function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  fun_1;
  Attribute *attr_2;
  allocator local_1351;
  value_type local_1350 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1330 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1310 [32];
  ostringstream local_12f0 [8];
  ostringstream ss_w_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1178;
  string local_1158;
  allocator local_1131;
  key_type local_1130 [4];
  _Base_ptr local_1110;
  undefined1 local_1108;
  allocator local_10f9;
  value_type local_10f8 [4];
  function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_10d8;
  allocator local_10b1;
  string local_10b0;
  undefined1 local_1090 [8];
  function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  fun;
  Attribute *attr_1;
  allocator local_1051;
  value_type local_1050 [4];
  Attribute *local_1030;
  Attribute *attr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1008 [32];
  ostringstream local_fe8 [8];
  ostringstream ss_w;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e70;
  string local_e50;
  allocator local_e29;
  key_type local_e28 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e08 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_de8 [39];
  allocator local_dc1;
  string local_dc0 [32];
  string local_da0;
  ostringstream local_d80 [8];
  ostringstream ss_e_5;
  allocator local_c01;
  undefined1 local_c00 [32];
  undefined1 local_be0 [40];
  ParseResult ret_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b78 [39];
  allocator local_b51;
  string local_b50 [32];
  string local_b30;
  ostringstream local_b10 [8];
  ostringstream ss_e_4;
  allocator local_991;
  undefined1 local_990 [32];
  undefined1 local_970 [40];
  ParseResult ret_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_908 [39];
  allocator local_8e1;
  string local_8e0 [32];
  string local_8c0;
  ostringstream local_8a0 [8];
  ostringstream ss_e_3;
  allocator local_721;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [8];
  ParseResult ret_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_698 [39];
  allocator local_671;
  string local_670 [32];
  string local_650;
  ostringstream local_630 [8];
  ostringstream ss_e_2;
  allocator local_4b1;
  undefined1 local_4b0 [32];
  undefined1 local_490 [32];
  undefined1 local_470 [8];
  ParseResult ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428 [32];
  ostringstream local_408 [8];
  ostringstream ss_e_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270 [32];
  ostringstream local_250 [8];
  ostringstream ss_e;
  allocator local_c1;
  value_type local_c0 [5];
  Relationship *rel;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_conflict
  *prop;
  const_iterator __end2;
  const_iterator __begin2;
  PropertyMap *__range2;
  undefined1 local_70 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  string *err_local;
  string *warn_local;
  Skeleton *skel_local;
  ReferenceList *references_local;
  PropertyMap *properties_local;
  Specifier *spec_local;
  
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)err;
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_70);
  bVar2 = ReconstructXformOpsFromProperties
                    (spec,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_70,properties,
                     (vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)skel,
                     (string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (bVar2) {
    __end2 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
             ::begin(properties);
    prop = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_conflict
            *)::std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
              ::end(properties);
    while (bVar2 = ::std::operator!=(&__end2,(_Self *)&prop), bVar2) {
      rel = (Relationship *)
            ::std::
            _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
            ::operator*(&__end2);
      bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )rel,"skel:animationSource");
      if (bVar2) {
        bVar2 = Property::is_relationship
                          ((Property *)((long)&(rel->targetPath)._prim_part.field_2 + 8));
        if (bVar2) {
          this = Property::get_relationship
                           ((Property *)((long)&(rel->targetPath)._prim_part.field_2 + 8));
          bVar2 = Relationship::is_path(this);
          if (bVar2) {
            local_c0[4].loc =
                 (int64_t)Property::get_relationship
                                    ((Property *)((long)&(rel->targetPath)._prim_part.field_2 + 8));
            bVar2 = Relationship::is_path((Relationship *)local_c0[4].loc);
            if (bVar2) {
              nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                        (&skel->animationSource,(Relationship *)local_c0[4].loc);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string((string *)local_c0,"skel:animationSource",&local_c1);
              ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_70,local_c0);
              ::std::__cxx11::string::~string((string *)local_c0);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_c1);
              goto LAB_0029b574;
            }
            ::std::__cxx11::ostringstream::ostringstream(local_250);
            poVar7 = ::std::operator<<((ostream *)local_250,"[error]");
            poVar7 = ::std::operator<<(poVar7,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar7 = ::std::operator<<(poVar7,":");
            poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
            poVar7 = ::std::operator<<(poVar7,"():");
            poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xb62);
            ::std::operator<<(poVar7," ");
            poVar7 = ::std::operator<<((ostream *)local_250,"`");
            poVar7 = ::std::operator<<(poVar7,"skel:animationSource");
            poVar7 = ::std::operator<<(poVar7,"` target must be Path.");
            ::std::operator<<(poVar7,"\n");
            if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(local_270,local_290);
              ::std::__cxx11::string::operator=
                        ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         (string *)local_270);
              ::std::__cxx11::string::~string((string *)local_270);
              ::std::__cxx11::string::~string((string *)local_290);
            }
            spec_local._7_1_ = 0;
            ::std::__cxx11::ostringstream::~ostringstream(local_250);
            goto LAB_0029ccfa;
          }
        }
        ::std::__cxx11::ostringstream::ostringstream(local_408);
        poVar7 = ::std::operator<<((ostream *)local_408,"[error]");
        poVar7 = ::std::operator<<(poVar7,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar7 = ::std::operator<<(poVar7,":");
        poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
        poVar7 = ::std::operator<<(poVar7,"():");
        poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xb67);
        ::std::operator<<(poVar7," ");
        poVar7 = ::std::operator<<((ostream *)local_408,"`");
        poVar7 = ::std::operator<<(poVar7,"skel:animationSource");
        poVar7 = ::std::operator<<(poVar7,"` must be a Relationship with Path target.");
        ::std::operator<<(poVar7,"\n");
        if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_428,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (ret.err.field_2._M_local_buf + 8));
          ::std::__cxx11::string::operator=
                    ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (string *)local_428);
          ::std::__cxx11::string::~string((string *)local_428);
          ::std::__cxx11::string::~string((string *)(ret.err.field_2._M_local_buf + 8));
        }
        spec_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_408);
        goto LAB_0029ccfa;
      }
LAB_0029b574:
      ::std::__cxx11::string::string((string *)local_490,(string *)rel);
      pPVar1 = &rel->targetPath;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)local_4b0,"bindTransforms",&local_4b1);
      pPVar8 = (Property *)local_4b0;
      (anonymous_namespace)::
      ParseTypedAttribute<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>
                ((ParseResult *)local_470,(_anonymous_namespace_ *)local_70,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_490,(string *)((long)&(pPVar1->_prim_part).field_2 + 8),pPVar8,
                 (string *)&skel->bindTransforms,in_stack_ffffffffffffe6e8);
      ::std::__cxx11::string::~string((string *)local_4b0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
      ::std::__cxx11::string::~string((string *)local_490);
      if ((local_470._0_4_ == Success) || (local_470._0_4_ == AlreadyProcessed)) {
        __range2._4_4_ = 3;
      }
      else if (local_470._0_4_ == Unmatched) {
        __range2._4_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_630);
        poVar7 = ::std::operator<<((ostream *)local_630,"[error]");
        poVar7 = ::std::operator<<(poVar7,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar7 = ::std::operator<<(poVar7,":");
        poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
        poVar7 = ::std::operator<<(poVar7,"():");
        poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xb6d);
        ::std::operator<<(poVar7," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_670,"Parsing attribute `{}` failed. Error: {}",&local_671);
        fmt::format<char[15],std::__cxx11::string>
                  (&local_650,(fmt *)local_670,(string *)"bindTransforms",(char (*) [15])&ret,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar8);
        poVar7 = ::std::operator<<((ostream *)local_630,(string *)&local_650);
        ::std::operator<<(poVar7,"\n");
        ::std::__cxx11::string::~string((string *)&local_650);
        ::std::__cxx11::string::~string(local_670);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_671);
        if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_698,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (ret_1.err.field_2._M_local_buf + 8));
          ::std::__cxx11::string::operator=
                    ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (string *)local_698);
          ::std::__cxx11::string::~string((string *)local_698);
          ::std::__cxx11::string::~string((string *)(ret_1.err.field_2._M_local_buf + 8));
        }
        spec_local._7_1_ = 0;
        __range2._4_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_630);
      }
      anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_470);
      if (__range2._4_4_ != 0) {
        if (__range2._4_4_ == 3) goto LAB_0029cce1;
        goto LAB_0029ccfa;
      }
      ::std::__cxx11::string::string((string *)local_700,(string *)rel);
      pPVar1 = &rel->targetPath;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)local_720,"joints",&local_721);
      pPVar8 = (Property *)local_720;
      (anonymous_namespace)::
      ParseTypedAttribute<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                ((ParseResult *)local_6e0,(_anonymous_namespace_ *)local_70,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_700,(string *)((long)&(pPVar1->_prim_part).field_2 + 8),pPVar8,
                 (string *)&skel->joints,
                 (TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> *)
                 in_stack_ffffffffffffe6e8);
      ::std::__cxx11::string::~string((string *)local_720);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_721);
      ::std::__cxx11::string::~string((string *)local_700);
      if ((local_6e0._0_4_ == Success) || (local_6e0._0_4_ == AlreadyProcessed)) {
        __range2._4_4_ = 3;
      }
      else if (local_6e0._0_4_ == Unmatched) {
        __range2._4_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_8a0);
        poVar7 = ::std::operator<<((ostream *)local_8a0,"[error]");
        poVar7 = ::std::operator<<(poVar7,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar7 = ::std::operator<<(poVar7,":");
        poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
        poVar7 = ::std::operator<<(poVar7,"():");
        poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xb6e);
        ::std::operator<<(poVar7," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_8e0,"Parsing attribute `{}` failed. Error: {}",&local_8e1);
        fmt::format<char[7],std::__cxx11::string>
                  (&local_8c0,(fmt *)local_8e0,(string *)"joints",(char (*) [7])&ret_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar8);
        poVar7 = ::std::operator<<((ostream *)local_8a0,(string *)&local_8c0);
        ::std::operator<<(poVar7,"\n");
        ::std::__cxx11::string::~string((string *)&local_8c0);
        ::std::__cxx11::string::~string(local_8e0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_8e1);
        if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_908,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (ret_2.err.field_2._M_local_buf + 8));
          ::std::__cxx11::string::operator=
                    ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (string *)local_908);
          ::std::__cxx11::string::~string((string *)local_908);
          ::std::__cxx11::string::~string((string *)(ret_2.err.field_2._M_local_buf + 8));
        }
        spec_local._7_1_ = 0;
        __range2._4_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_8a0);
      }
      anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_6e0);
      if (__range2._4_4_ == 0) {
        ::std::__cxx11::string::string((string *)local_970,(string *)rel);
        pPVar1 = &rel->targetPath;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)local_990,"jointNames",&local_991);
        pPVar8 = (Property *)local_990;
        (anonymous_namespace)::
        ParseTypedAttribute<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                  ((ParseResult *)(local_970 + 0x20),(_anonymous_namespace_ *)local_70,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_970,(string *)((long)&(pPVar1->_prim_part).field_2 + 8),pPVar8,
                   (string *)&skel->jointNames,
                   (TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                    *)in_stack_ffffffffffffe6e8);
        ::std::__cxx11::string::~string((string *)local_990);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_991);
        ::std::__cxx11::string::~string((string *)local_970);
        if ((local_970._32_4_ == 0) || (local_970._32_4_ == 2)) {
          __range2._4_4_ = 3;
        }
        else if (local_970._32_4_ == 1) {
          __range2._4_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_b10);
          poVar7 = ::std::operator<<((ostream *)local_b10,"[error]");
          poVar7 = ::std::operator<<(poVar7,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar7 = ::std::operator<<(poVar7,":");
          poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
          poVar7 = ::std::operator<<(poVar7,"():");
          poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xb6f);
          ::std::operator<<(poVar7," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_b50,"Parsing attribute `{}` failed. Error: {}",&local_b51);
          fmt::format<char[11],std::__cxx11::string>
                    (&local_b30,(fmt *)local_b50,(string *)"jointNames",(char (*) [11])&ret_2,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar8);
          poVar7 = ::std::operator<<((ostream *)local_b10,(string *)&local_b30);
          ::std::operator<<(poVar7,"\n");
          ::std::__cxx11::string::~string((string *)&local_b30);
          ::std::__cxx11::string::~string(local_b50);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_b51);
          if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_b78,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (ret_3.err.field_2._M_local_buf + 8));
            ::std::__cxx11::string::operator=
                      ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (string *)local_b78);
            ::std::__cxx11::string::~string((string *)local_b78);
            ::std::__cxx11::string::~string((string *)(ret_3.err.field_2._M_local_buf + 8));
          }
          spec_local._7_1_ = 0;
          __range2._4_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_b10);
        }
        anon_unknown_0::ParseResult::~ParseResult((ParseResult *)(local_970 + 0x20));
        if (__range2._4_4_ != 0) goto joined_r0x0029c40a;
        ::std::__cxx11::string::string((string *)local_be0,(string *)rel);
        pPVar1 = &rel->targetPath;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)local_c00,"restTransforms",&local_c01);
        pPVar8 = (Property *)local_c00;
        (anonymous_namespace)::
        ParseTypedAttribute<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>
                  ((ParseResult *)(local_be0 + 0x20),(_anonymous_namespace_ *)local_70,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_be0,(string *)((long)&(pPVar1->_prim_part).field_2 + 8),pPVar8,
                   (string *)&skel->restTransforms,in_stack_ffffffffffffe6e8);
        ::std::__cxx11::string::~string((string *)local_c00);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_c01);
        ::std::__cxx11::string::~string((string *)local_be0);
        if ((local_be0._32_4_ == 0) || (local_be0._32_4_ == 2)) {
          __range2._4_4_ = 3;
        }
        else if (local_be0._32_4_ == 1) {
          __range2._4_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_d80);
          poVar7 = ::std::operator<<((ostream *)local_d80,"[error]");
          poVar7 = ::std::operator<<(poVar7,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar7 = ::std::operator<<(poVar7,":");
          poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
          poVar7 = ::std::operator<<(poVar7,"():");
          poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xb70);
          ::std::operator<<(poVar7," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_dc0,"Parsing attribute `{}` failed. Error: {}",&local_dc1);
          fmt::format<char[15],std::__cxx11::string>
                    (&local_da0,(fmt *)local_dc0,(string *)"restTransforms",(char (*) [15])&ret_3,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar8);
          poVar7 = ::std::operator<<((ostream *)local_d80,(string *)&local_da0);
          ::std::operator<<(poVar7,"\n");
          ::std::__cxx11::string::~string((string *)&local_da0);
          ::std::__cxx11::string::~string(local_dc0);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_dc1);
          if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_de8,local_e08);
            ::std::__cxx11::string::operator=
                      ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (string *)local_de8);
            ::std::__cxx11::string::~string((string *)local_de8);
            ::std::__cxx11::string::~string((string *)local_e08);
          }
          spec_local._7_1_ = 0;
          __range2._4_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_d80);
        }
        anon_unknown_0::ParseResult::~ParseResult((ParseResult *)(local_be0 + 0x20));
        if (__range2._4_4_ != 0) goto joined_r0x0029c40a;
        bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)rel,"visibility");
        if (bVar2) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)local_e28,"visibility",&local_e29);
          sVar6 = ::std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_70,local_e28);
          ::std::__cxx11::string::~string((string *)local_e28);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_e29);
          if (sVar6 == 0) {
            Property::value_type_name_abi_cxx11_
                      (&local_e50,(Property *)((long)&(rel->targetPath)._prim_part.field_2 + 8));
            tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
            _Var3 = ::std::operator==(&local_e50,&local_e70);
            local_18b1 = false;
            if (_Var3) {
              bVar2 = Property::is_attribute
                                ((Property *)((long)&(rel->targetPath)._prim_part.field_2 + 8));
              local_18b1 = false;
              if (bVar2) {
                local_18b1 = Property::is_empty((Property *)
                                                ((long)&(rel->targetPath)._prim_part.field_2 + 8));
              }
            }
            ::std::__cxx11::string::~string((string *)&local_e70);
            ::std::__cxx11::string::~string((string *)&local_e50);
            if (local_18b1 == false) {
              fun._M_invoker =
                   (_Invoker_type)
                   Property::get_attribute
                             ((Property *)((long)&(rel->targetPath)._prim_part.field_2 + 8));
              ::std::
              function<nonstd::expected_lite::expected<tinyusdz::Visibility,std::__cxx11::string>(std::__cxx11::string_const&)>
              ::
              function<nonstd::expected_lite::expected<tinyusdz::Visibility,std::__cxx11::string>(&)(std::__cxx11::string_const&),void>
                        ((function<nonstd::expected_lite::expected<tinyusdz::Visibility,std::__cxx11::string>(std::__cxx11::string_const&)>
                          *)local_1090,VisibilityEnumHandler);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string((string *)&local_10b0,"visibility",&local_10b1);
              bVar2 = options->strict_allowedToken_check;
              ::std::
              function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::function(&local_10d8,
                         (function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)local_1090);
              in_stack_ffffffffffffe6e8 =
                   (TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                    *)table._M_t._M_impl.super__Rb_tree_header._M_node_count;
              bVar2 = ParseTimeSampledEnumProperty<tinyusdz::Visibility,tinyusdz::Visibility>
                                (&local_10b0,(bool)(bVar2 & 1),&local_10d8,
                                 (Attribute *)fun._M_invoker,&skel->visibility,warn,
                                 (string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count);
              ::std::
              function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::~function(&local_10d8);
              ::std::__cxx11::string::~string((string *)&local_10b0);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_10b1);
              if (((bVar2 ^ 0xffU) & 1) == 0) {
                pAVar4 = Attribute::metas((Attribute *)fun._M_invoker);
                pAVar5 = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_>::
                         metas(&skel->visibility);
                AttrMetas::operator=(pAVar5,pAVar4);
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string((string *)local_10f8,"visibility",&local_10f9);
                pVar9 = ::std::
                        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_70,local_10f8);
                local_1110 = (_Base_ptr)pVar9.first._M_node;
                local_1108 = pVar9.second;
                ::std::__cxx11::string::~string((string *)local_10f8);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_10f9);
                __range2._4_4_ = 3;
              }
              else {
                spec_local._7_1_ = 0;
                __range2._4_4_ = 1;
              }
              ::std::
              function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::~function((function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                           *)local_1090);
              goto joined_r0x0029c40a;
            }
            ::std::__cxx11::ostringstream::ostringstream(local_fe8);
            poVar7 = ::std::operator<<((ostream *)local_fe8,"[warn]");
            poVar7 = ::std::operator<<(poVar7,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar7 = ::std::operator<<(poVar7,":");
            poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
            poVar7 = ::std::operator<<(poVar7,"():");
            poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xb72);
            ::std::operator<<(poVar7," ");
            poVar7 = ::std::operator<<((ostream *)local_fe8,"No value assigned to `");
            poVar7 = ::std::operator<<(poVar7,"visibility");
            poVar7 = ::std::operator<<(poVar7,"` token attribute. Set default token value.");
            ::std::operator<<(poVar7,"\n");
            if (warn != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(local_1008,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &attr);
              ::std::__cxx11::string::operator=((string *)warn,(string *)local_1008);
              ::std::__cxx11::string::~string((string *)local_1008);
              ::std::__cxx11::string::~string((string *)&attr);
            }
            ::std::__cxx11::ostringstream::~ostringstream(local_fe8);
            local_1030 = Property::get_attribute
                                   ((Property *)((long)&(rel->targetPath)._prim_part.field_2 + 8));
            pAVar4 = Attribute::metas(local_1030);
            pAVar5 = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_>::metas
                               (&skel->visibility);
            AttrMetas::operator=(pAVar5,pAVar4);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)local_1050,"visibility",&local_1051);
            ::std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_70,local_1050);
            ::std::__cxx11::string::~string((string *)local_1050);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_1051);
          }
        }
        else {
          bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)rel,"purpose");
          if (bVar2) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)local_1130,"purpose",&local_1131);
            sVar6 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_70,local_1130);
            ::std::__cxx11::string::~string((string *)local_1130);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_1131);
            if (sVar6 == 0) {
              Property::value_type_name_abi_cxx11_
                        (&local_1158,(Property *)((long)&(rel->targetPath)._prim_part.field_2 + 8));
              tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
              _Var3 = ::std::operator==(&local_1158,&local_1178);
              local_18d9 = false;
              if (_Var3) {
                bVar2 = Property::is_attribute
                                  ((Property *)((long)&(rel->targetPath)._prim_part.field_2 + 8));
                local_18d9 = false;
                if (bVar2) {
                  local_18d9 = Property::is_empty((Property *)
                                                  ((long)&(rel->targetPath)._prim_part.field_2 + 8))
                  ;
                }
              }
              ::std::__cxx11::string::~string((string *)&local_1178);
              ::std::__cxx11::string::~string((string *)&local_1158);
              if (local_18d9 == false) {
                fun_1._M_invoker =
                     (_Invoker_type)
                     Property::get_attribute
                               ((Property *)((long)&(rel->targetPath)._prim_part.field_2 + 8));
                ::std::
                function<nonstd::expected_lite::expected<tinyusdz::Purpose,std::__cxx11::string>(std::__cxx11::string_const&)>
                ::
                function<nonstd::expected_lite::expected<tinyusdz::Purpose,std::__cxx11::string>(&)(std::__cxx11::string_const&),void>
                          ((function<nonstd::expected_lite::expected<tinyusdz::Purpose,std::__cxx11::string>(std::__cxx11::string_const&)>
                            *)local_1390,PurposeEnumHandler);
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string((string *)&local_13b0,"purpose",&local_13b1);
                bVar2 = options->strict_allowedToken_check;
                ::std::
                function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                ::function(&local_13d8,
                           (function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            *)local_1390);
                in_stack_ffffffffffffe6e8 =
                     (TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                      *)table._M_t._M_impl.super__Rb_tree_header._M_node_count;
                bVar2 = ParseUniformEnumProperty<tinyusdz::Purpose,tinyusdz::Purpose>
                                  (&local_13b0,(bool)(bVar2 & 1),&local_13d8,
                                   (Attribute *)fun_1._M_invoker,&skel->purpose,warn,
                                   (string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count)
                ;
                ::std::
                function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                ::~function(&local_13d8);
                ::std::__cxx11::string::~string((string *)&local_13b0);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_13b1);
                if (((bVar2 ^ 0xffU) & 1) == 0) {
                  pAVar4 = Attribute::metas((Attribute *)fun_1._M_invoker);
                  pAVar5 = TypedAttributeWithFallback<tinyusdz::Purpose>::metas(&skel->purpose);
                  AttrMetas::operator=(pAVar5,pAVar4);
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string((string *)local_13f8,"purpose",&local_13f9);
                  pVar9 = ::std::
                          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_70,local_13f8);
                  ret_4.err.field_2._8_8_ = pVar9.first._M_node;
                  ::std::__cxx11::string::~string((string *)local_13f8);
                  ::std::allocator<char>::~allocator((allocator<char> *)&local_13f9);
                  __range2._4_4_ = 3;
                }
                else {
                  spec_local._7_1_ = 0;
                  __range2._4_4_ = 1;
                }
                ::std::
                function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                ::~function((function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                             *)local_1390);
                goto joined_r0x0029c40a;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_12f0);
              poVar7 = ::std::operator<<((ostream *)local_12f0,"[warn]");
              poVar7 = ::std::operator<<(poVar7,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar7 = ::std::operator<<(poVar7,":");
              poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
              poVar7 = ::std::operator<<(poVar7,"():");
              poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xb74);
              ::std::operator<<(poVar7," ");
              poVar7 = ::std::operator<<((ostream *)local_12f0,"No value assigned to `");
              poVar7 = ::std::operator<<(poVar7,"purpose");
              poVar7 = ::std::operator<<(poVar7,"` token attribute. Set default token value.");
              ::std::operator<<(poVar7,"\n");
              if (warn != (string *)0x0) {
                ::std::__cxx11::ostringstream::str();
                ::std::operator+(local_1310,local_1330);
                ::std::__cxx11::string::operator=((string *)warn,(string *)local_1310);
                ::std::__cxx11::string::~string((string *)local_1310);
                ::std::__cxx11::string::~string((string *)local_1330);
              }
              ::std::__cxx11::ostringstream::~ostringstream(local_12f0);
              this_00 = Property::get_attribute
                                  ((Property *)((long)&(rel->targetPath)._prim_part.field_2 + 8));
              pAVar4 = Attribute::metas(this_00);
              pAVar5 = TypedAttributeWithFallback<tinyusdz::Purpose>::metas(&skel->purpose);
              AttrMetas::operator=(pAVar5,pAVar4);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string((string *)local_1350,"purpose",&local_1351);
              ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_70,local_1350);
              ::std::__cxx11::string::~string((string *)local_1350);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_1351);
            }
          }
          else {
            ::std::__cxx11::string::string((string *)&local_1458,(string *)rel);
            pPVar1 = &rel->targetPath;
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)&local_1478,"extent",&local_1479);
            anon_unknown_0::ParseExtentAttribute
                      ((ParseResult *)local_1438,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_70,&local_1458,(Property *)((long)&(pPVar1->_prim_part).field_2 + 8)
                       ,&local_1478,&skel->extent);
            ::std::__cxx11::string::~string((string *)&local_1478);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_1479);
            ::std::__cxx11::string::~string((string *)&local_1458);
            if ((local_1438._0_4_ == Success) || (local_1438._0_4_ == AlreadyProcessed)) {
              __range2._4_4_ = 3;
            }
            else if (local_1438._0_4_ == Unmatched) {
              __range2._4_4_ = 0;
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream(local_15f8);
              poVar7 = ::std::operator<<((ostream *)local_15f8,"[error]");
              poVar7 = ::std::operator<<(poVar7,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar7 = ::std::operator<<(poVar7,":");
              poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
              poVar7 = ::std::operator<<(poVar7,"():");
              poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xb75);
              ::std::operator<<(poVar7," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_1638,"Parsing attribute `extent` failed. Error: {}",&local_1639);
              fmt::format<std::__cxx11::string>
                        (local_1618,(string *)local_1638,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret_4
                        );
              poVar7 = ::std::operator<<((ostream *)local_15f8,(string *)local_1618);
              ::std::operator<<(poVar7,"\n");
              ::std::__cxx11::string::~string((string *)local_1618);
              ::std::__cxx11::string::~string(local_1638);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_1639);
              if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
                ::std::__cxx11::ostringstream::str();
                ::std::operator+(local_1660,local_1680);
                ::std::__cxx11::string::operator=
                          ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           (string *)local_1660);
                ::std::__cxx11::string::~string((string *)local_1660);
                ::std::__cxx11::string::~string((string *)local_1680);
              }
              spec_local._7_1_ = 0;
              __range2._4_4_ = 1;
              ::std::__cxx11::ostringstream::~ostringstream(local_15f8);
            }
            anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_1438);
            if (__range2._4_4_ != 0) goto joined_r0x0029c40a;
            sVar6 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_70,(key_type *)rel);
            if (sVar6 == 0) {
              pPVar1 = &rel->targetPath;
              this_01 = ::std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                        ::operator[](&skel->props,(key_type *)rel);
              Property::operator=(this_01,(Property *)((long)&(pPVar1->_prim_part).field_2 + 8));
              ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_70,(value_type_conflict *)rel);
            }
            sVar6 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_70,(key_type *)rel);
            if (sVar6 == 0) {
              ::std::__cxx11::ostringstream::ostringstream(local_1808);
              poVar7 = ::std::operator<<((ostream *)local_1808,"[error]");
              poVar7 = ::std::operator<<(poVar7,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar7 = ::std::operator<<(poVar7,":");
              poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
              poVar7 = ::std::operator<<(poVar7,"():");
              poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xb77);
              ::std::operator<<(poVar7," ");
              ::std::operator+(&local_1828,"Unsupported/unimplemented property: ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               rel);
              poVar7 = ::std::operator<<((ostream *)local_1808,(string *)&local_1828);
              ::std::operator<<(poVar7,"\n");
              ::std::__cxx11::string::~string((string *)&local_1828);
              if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
                ::std::__cxx11::ostringstream::str();
                ::std::operator+(local_1848,local_1868);
                ::std::__cxx11::string::operator=
                          ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           (string *)local_1848);
                ::std::__cxx11::string::~string((string *)local_1848);
                ::std::__cxx11::string::~string((string *)local_1868);
              }
              spec_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_1808);
              goto LAB_0029ccfa;
            }
          }
        }
      }
      else {
joined_r0x0029c40a:
        if (__range2._4_4_ != 3) goto LAB_0029ccfa;
      }
LAB_0029cce1:
      ::std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
      ::operator++(&__end2);
    }
    spec_local._7_1_ = 1;
  }
  else {
    spec_local._7_1_ = 0;
  }
LAB_0029ccfa:
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_70);
  return (bool)(spec_local._7_1_ & 1);
}

Assistant:

bool ReconstructPrim<Skeleton>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    Skeleton *skel,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)warn;
  (void)references;
  (void)options;

  std::set<std::string> table;
  if (!prim::ReconstructXformOpsFromProperties(spec, table, properties, &skel->xformOps, err)) {
    return false;
  }

  for (auto &prop : properties) {

    // SkelBindingAPI
    if (prop.first == kSkelAnimationSource) {

      // Must be relation of type Path.
      if (prop.second.is_relationship() && prop.second.get_relationship().is_path()) {
        {
          const Relationship &rel = prop.second.get_relationship();
          if (rel.is_path()) {
            skel->animationSource = rel;
            table.insert(kSkelAnimationSource);
          } else {
            PUSH_ERROR_AND_RETURN("`" << kSkelAnimationSource << "` target must be Path.");
          }
        }
      } else {
        PUSH_ERROR_AND_RETURN(
            "`" << kSkelAnimationSource << "` must be a Relationship with Path target.");
      }
    }

    //

    PARSE_TYPED_ATTRIBUTE(table, prop, "bindTransforms", Skeleton, skel->bindTransforms)
    PARSE_TYPED_ATTRIBUTE(table, prop, "joints", Skeleton, skel->joints)
    PARSE_TYPED_ATTRIBUTE(table, prop, "jointNames", Skeleton, skel->jointNames)
    PARSE_TYPED_ATTRIBUTE(table, prop, "restTransforms", Skeleton, skel->restTransforms)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, kVisibility, Visibility, VisibilityEnumHandler, Skeleton,
                   skel->visibility, options.strict_allowedToken_check)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, "purpose", Purpose, PurposeEnumHandler, Skeleton,
                       skel->purpose, options.strict_allowedToken_check)
    PARSE_EXTENT_ATTRIBUTE(table, prop, "extent", Skeleton, skel->extent)
    ADD_PROPERTY(table, prop, Skeleton, skel->props)
    PARSE_PROPERTY_END_MAKE_ERROR(table, prop)
  }

#if 0 // TODO: bindTransforms & restTransforms check somewhere.
  // usdview and Houdini USD importer expects both `bindTransforms` and `restTransforms` are authored in USD
  if (!table.count("bindTransforms")) {
    // usdview and Houdini allow `bindTransforms` is not authord in USD, but it cannot compute skinning correctly without it,
    // so report an error in TinyUSDZ for a while.
    PUSH_ERROR_AND_RETURN_TAG(kTag, "`bindTransforms` is missing in Skeleton. Currently TinyUSDZ expects `bindTransforms` must exist in Skeleton.");
  }

  if (!table.count("restTransforms")) {
    // usdview and Houdini allow `restTransforms` is not authord in USD(usdview warns it), but it cannot compute skinning correctly without it,
    // (even SkelAnimation supplies trasnforms for all joints)
    // so report an error in TinyUSDZ for a while.
    PUSH_ERROR_AND_RETURN_TAG(kTag, "`restTransforms`(local joint matrices at rest state) is missing in Skeleton. Currently TinyUSDZ expects `restTransforms` must exist in Skeleton.");
  }

  // len(bindTransforms) must be equal to len(restTransforms)
  // TODO: Support connection
  {
    bool valid = false;
    if (auto bt = skel->bindTransforms.get_value()) {
      if (auto rt = skel->restTransforms.get_value()) {
        if (bt.value().size() == rt.value().size()) {
          // ok
          valid = true;
        }
      }
    }

    if (!valid) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Array length must be same for `bindTransforms` and `restTransforms`.");
    }
  }
#endif

  return true;
}